

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::computeNewDt
          (NavierStokesBase *this,int finest_level,int param_3,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_5,
          Vector<double,_std::allocator<double>_> *dt_min,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time,int post_regrid_flag)

{
  double *pdVar1;
  double *pdVar2;
  int *piVar3;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  Real RVar5;
  int in_stack_00000010;
  Real cur_time;
  Real eps;
  NavierStokesBase *adv_level;
  int n_factor;
  Real dt_0;
  int i;
  char (*in_stack_fffffffffffff9f8) [57];
  NavierStokesBase *in_stack_fffffffffffffa00;
  Print *in_stack_fffffffffffffa20;
  Print *in_stack_fffffffffffffa28;
  Print *in_stack_fffffffffffffa30;
  Print *in_stack_fffffffffffffa70;
  double local_528;
  double local_520;
  undefined1 local_511;
  double local_510;
  undefined1 local_379;
  undefined1 local_1ed;
  double local_58;
  NavierStokesBase *local_50;
  int local_44;
  double local_40;
  int local_34;
  double local_30;
  int local_c;
  
  if (*(int *)(in_RDI + 8) < 1) {
    local_40 = 1e+100;
    local_44 = 1;
    local_30 = in_XMM0_Qa;
    local_c = in_ESI;
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      local_50 = getLevel(in_stack_fffffffffffffa00,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20))
      ;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      (*(local_50->super_AmrLevel)._vptr_AmrLevel[0x31])();
      pdVar1 = std::min<double>(pdVar1,&local_58);
      dVar4 = *pdVar1;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      *pdVar1 = dVar4;
    }
    if (fixed_dt <= 0.0) {
      if (in_stack_00000010 == 1) {
        for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
          pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          pdVar2 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          pdVar1 = std::min<double>(pdVar1,pdVar2);
          dVar4 = *pdVar1;
          pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          *pdVar1 = dVar4;
        }
      }
      else {
        for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
          if (verbose != 0) {
            pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00
                                ,(size_type)in_stack_fffffffffffff9f8);
            RVar5 = change_max;
            dVar4 = *pdVar1;
            pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                               ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00
                                ,(size_type)in_stack_fffffffffffff9f8);
            if (RVar5 * *pdVar1 < dVar4) {
              amrex::OutStream();
              amrex::Print::Print(in_stack_fffffffffffffa30,(ostream *)in_stack_fffffffffffffa28);
              amrex::Print::operator<<((Print *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8)
              ;
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,(int *)in_stack_fffffffffffff9f8);
              local_1ed = 10;
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,*in_stack_fffffffffffff9f8);
              amrex::Print::~Print(in_stack_fffffffffffffa70);
              amrex::OutStream();
              amrex::Print::Print(in_stack_fffffffffffffa30,(ostream *)in_stack_fffffffffffffa28);
              in_stack_fffffffffffffa70 =
                   amrex::Print::operator<<
                             ((Print *)in_stack_fffffffffffffa00,
                              (char (*) [23])in_stack_fffffffffffff9f8);
              amrex::Vector<double,_std::allocator<double>_>::operator[]
                        ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                         (size_type)in_stack_fffffffffffff9f8);
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8);
              local_379 = 10;
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,*in_stack_fffffffffffff9f8);
              amrex::Print::~Print(in_stack_fffffffffffffa70);
              amrex::OutStream();
              amrex::Print::Print(in_stack_fffffffffffffa30,(ostream *)in_stack_fffffffffffffa28);
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,(char (*) [23])in_stack_fffffffffffff9f8
                        );
              RVar5 = change_max;
              pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                                 ((Vector<double,_std::allocator<double>_> *)
                                  in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
              local_510 = RVar5 * *pdVar1;
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8);
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,(char (*) [4])in_stack_fffffffffffff9f8)
              ;
              in_stack_fffffffffffffa30 =
                   amrex::Print::operator<<
                             ((Print *)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8
                             );
              in_stack_fffffffffffffa28 =
                   amrex::Print::operator<<
                             ((Print *)in_stack_fffffffffffffa00,
                              (char (*) [4])in_stack_fffffffffffff9f8);
              amrex::Vector<double,_std::allocator<double>_>::operator[]
                        ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                         (size_type)in_stack_fffffffffffff9f8);
              in_stack_fffffffffffffa20 =
                   amrex::Print::operator<<
                             ((Print *)in_stack_fffffffffffffa00,(double *)in_stack_fffffffffffff9f8
                             );
              local_511 = 10;
              amrex::Print::operator<<
                        ((Print *)in_stack_fffffffffffffa00,*in_stack_fffffffffffff9f8);
              amrex::Print::~Print(in_stack_fffffffffffffa70);
            }
          }
          pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          RVar5 = change_max;
          pdVar2 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          local_520 = RVar5 * *pdVar2;
          pdVar1 = std::min<double>(pdVar1,&local_520);
          dVar4 = *pdVar1;
          pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                             ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                              (size_type)in_stack_fffffffffffff9f8);
          *pdVar1 = dVar4;
        }
      }
    }
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      piVar3 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      local_44 = *piVar3 * local_44;
      in_stack_fffffffffffffa00 = (NavierStokesBase *)(double)local_44;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      local_528 = (double)in_stack_fffffffffffffa00 * *pdVar1;
      pdVar1 = std::min<double>(&local_40,&local_528);
      local_40 = *pdVar1;
    }
    dVar4 = local_40 * 0.0001;
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8);
    RVar5 = amrex::StateData::curTime((StateData *)in_stack_fffffffffffffa20);
    if ((0.0 <= local_30) && (local_30 - dVar4 < RVar5 + local_40)) {
      local_40 = local_30 - RVar5;
    }
    local_44 = 1;
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      piVar3 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      local_44 = *piVar3 * local_44;
      in_stack_fffffffffffff9f8 = (char (*) [57])(local_40 / (double)local_44);
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00,
                          (size_type)in_stack_fffffffffffff9f8);
      *pdVar1 = (double)in_stack_fffffffffffff9f8;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::computeNewDt (int                   finest_level,
				int                   /*sub_cycle*/,
				Vector<int>&           n_cycle,
				const Vector<IntVect>& /*ref_ratio*/,
				Vector<Real>&          dt_min,
				Vector<Real>&          dt_level,
				Real                  stop_time,
				int                   post_regrid_flag)
{
    //
    // We are at the start of a coarse grid timecycle.
    // Compute the timesteps for the next iteration.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0     = 1.0e+100;
    int  n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        NavierStokesBase& adv_level = getLevel(i);
        dt_min[i] = std::min(dt_min[i],adv_level.estTimeStep());
    }

    if (fixed_dt <= 0.0)
    {
       if (post_regrid_flag == 1)
       {
          //
          // Limit dt's by pre-regrid dt
          //
          for (i = 0; i <= finest_level; i++)
          {
              dt_min[i] = std::min(dt_min[i],dt_level[i]);
          }
       }
       else
       {
          //
          // Limit dt's by change_max * old dt
          //
          for (i = 0; i <= finest_level; i++)
          {
	    if (verbose)
                 if (dt_min[i] > change_max*dt_level[i])
                 {
                     amrex::Print() << "NavierStokesBase::compute_new_dt : limiting dt at level "
				    << i << '\n';
                     amrex::Print() << " ... new dt computed: " << dt_min[i]
				    << '\n';
                     amrex::Print() << " ... but limiting to: "
				    << change_max * dt_level[i] << " = " << change_max
				    << " * " << dt_level[i] << '\n';
                 }
             dt_min[i] = std::min(dt_min[i],change_max*dt_level[i]);
          }
       }
    }

    //
    // Find the minimum over all levels
    //
    for (i = 0; i <= finest_level; i++)
    {
        n_factor *= n_cycle[i];
        dt_0      = std::min(dt_0,n_factor*dt_min[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    const Real eps      = 0.0001*dt_0;
    const Real cur_time = state[State_Type].curTime();
    if (stop_time >= 0.0)
    {
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    //
    // Set dt at each level of refinement
    //
    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}